

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Parameters PVar1;
  Incppect<true> *pIVar2;
  char *__s;
  long lVar3;
  undefined1 auStack_1e8 [5];
  int8_t var_int8;
  int16_t var_int16;
  _Any_data local_1e0;
  code *local_1d0;
  code *local_1c8;
  undefined1 local_1c0 [32];
  string local_1a0 [32];
  float var_float;
  int32_t var_int32;
  char *var_str;
  double var_double;
  int32_t var_arr32 [4];
  string httpRoot;
  Parameters parameters;
  Parameters local_a8;
  
  printf("Usage: %s [port] [httpRoot]\n",*argv);
  if (argc < 2) {
    __s = "../examples";
    parameters.portListen = 3000;
  }
  else {
    parameters.portListen = atoi(argv[1]);
    if (argc == 2) {
      __s = "../examples";
    }
    else {
      __s = argv[2];
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpRoot,__s,(allocator<char> *)&parameters);
  Incppect<true>::Parameters::Parameters(&parameters);
  parameters.maxPayloadLength_bytes = 0x40000;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 &httpRoot,"/hello-browser-ssl");
  std::__cxx11::string::operator=((string *)&parameters.httpRoot,(string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"",(allocator<char> *)local_1e0._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"index.html",(allocator<char> *)var_arr32);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &parameters.resources,local_1c0,&var_float);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_1c0 + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::assign((char *)&parameters.sslKey);
  std::__cxx11::string::assign((char *)&parameters.sslCert);
  Incppect<true>::getInstance();
  Incppect<true>::Parameters::Parameters(&local_a8,&parameters);
  PVar1.maxPayloadLength_bytes._1_1_ = var_int8;
  PVar1._0_5_ = auStack_1e8;
  PVar1.maxPayloadLength_bytes._2_2_ = var_int16;
  PVar1.tLastRequestTimeout_ms = local_1e0._M_unused._0_8_;
  PVar1._16_8_ = local_1e0._8_8_;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)local_1d0;
  PVar1.httpRoot._M_string_length = (size_type)local_1c8;
  PVar1.httpRoot.field_2._M_allocated_capacity = local_1c0._0_8_;
  PVar1._48_56_ = stack0xfffffffffffffe48;
  PVar1.sslKey.field_2._8_4_ = var_float;
  PVar1.sslKey.field_2._12_4_ = var_int32;
  PVar1.sslCert._M_dataplus._M_p = var_str;
  PVar1.sslCert._M_string_length = (size_type)var_double;
  PVar1.sslCert.field_2._0_4_ = var_arr32[0];
  PVar1.sslCert.field_2._4_4_ = var_arr32[1];
  PVar1.sslCert.field_2._8_4_ = var_arr32[2];
  PVar1.sslCert.field_2._12_4_ = var_arr32[3];
  Incppect<true>::runAsync(PVar1);
  std::thread::detach();
  std::thread::~thread((thread *)local_1c0);
  Incppect<true>::Parameters::~Parameters(&local_a8);
  var_int8 = '\x01';
  var_int16 = 2;
  var_int32 = 3;
  var_arr32[0] = 4;
  var_arr32[1] = 5;
  var_arr32[2] = 6;
  var_arr32[3] = 7;
  var_float = 8.0;
  var_double = 16.0;
  var_str = "hello browser over SSL";
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_int8",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1e0._M_unused._M_object = &var_int8;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:38:45)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:38:45)>
              ::_M_manager;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_int16",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1e0._M_unused._M_object = &var_int16;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:39:46)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:39:46)>
              ::_M_manager;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_int32",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1e0._M_unused._M_object = &var_int32;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:40:46)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:40:46)>
              ::_M_manager;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_int32_arr",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:41:50)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:41:50)>
              ::_M_manager;
  local_1e0._M_unused._0_8_ = (undefined8)(allocator<char> *)var_arr32;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_int32_arr[%d]",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:42:54)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:42:54)>
              ::_M_manager;
  local_1e0._M_unused._0_8_ = (allocator<char> *)var_arr32;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_float",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1e0._M_unused._M_object = &var_float;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:43:46)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:43:46)>
              ::_M_manager;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_double",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1e0._M_unused._M_object = &var_double;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:44:47)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:44:47)>
              ::_M_manager;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  pIVar2 = Incppect<true>::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"var_str",(allocator<char> *)(auStack_1e8 + 4));
  local_1e0._8_8_ = 0;
  local_1e0._M_unused._M_object = &var_str;
  local_1c8 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:45:44)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/hello-browser-ssl/main.cpp:45:44)>
              ::_M_manager;
  Incppect<true>::var((string *)pIVar2,(function *)local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  do {
    local_1c0._0_8_ = (pointer)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_1c0);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/hello-browser-ssl";
    parameters.resources = { "", "index.html", };

    // make sure you have generated those and they are valid
    parameters.sslKey = "key.pem";
    parameters.sslCert = "cert.pem";

    incppect::getInstance().runAsync(parameters).detach();

    int8_t  var_int8  = 1;
    int16_t var_int16 = 2;
    int32_t var_int32 = 3;
    int32_t var_arr32[4] = { 4, 5, 6, 7 };
    float   var_float = 8.0f;
    double  var_double = 16.0f;

    const char * var_str = "hello browser over SSL";

    incppect::getInstance().var("var_int8", [&](auto) { return incppect::view(var_int8); });
    incppect::getInstance().var("var_int16", [&](auto) { return incppect::view(var_int16); });
    incppect::getInstance().var("var_int32", [&](auto) { return incppect::view(var_int32); });
    incppect::getInstance().var("var_int32_arr", [&](auto) { return incppect::view(var_arr32); });
    incppect::getInstance().var("var_int32_arr[%d]", [&](auto idxs) { return incppect::view(var_arr32[idxs[0]]); });
    incppect::getInstance().var("var_float", [&](auto idxs) { return incppect::view(var_float); });
    incppect::getInstance().var("var_double", [&](auto idxs) { return incppect::view(var_double); });
    incppect::getInstance().var("var_str", [&](auto idxs) { return var_str; });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}